

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharacterClass.cpp
# Opt level: O0

CharacterClass * __thiscall CharacterClass::GetName_abi_cxx11_(CharacterClass *this)

{
  long in_RSI;
  CharacterClass *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)(in_RSI + 0x30));
  return this;
}

Assistant:

std::string CharacterClass::GetName() {
    return m_name;
}